

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluComposeLut(int nVars,If_Grp_t *g,word *t,word (*f) [1024],word *r)

{
  byte bVar1;
  ulong uVar2;
  int w_1;
  ulong uVar3;
  uint uVar4;
  word (*pawVar5) [1024];
  uint uVar6;
  ulong uVar7;
  ulong auStack_2018 [1025];
  
  uVar6 = 1 << ((char)nVars - 6U & 0x1f);
  uVar2 = 0;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  uVar7 = (ulong)uVar6;
  if (nVars < 7) {
    uVar7 = 1;
  }
  for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
    r[uVar2] = 0;
  }
  bVar1 = g->nVars;
  uVar6 = 1 << (bVar1 & 0x1f);
  uVar2 = 0;
  if ((char)bVar1 < '\x01') {
    bVar1 = 0;
  }
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  while (uVar4 = (uint)uVar2, uVar4 != uVar6) {
    if ((t[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
      for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
        auStack_2018[uVar2] = 0xffffffffffffffff;
      }
      pawVar5 = f;
      for (uVar2 = 0; uVar2 != bVar1; uVar2 = uVar2 + 1) {
        uVar3 = 0;
        if ((uVar4 >> ((uint)uVar2 & 0x1f) & 1) == 0) {
          for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            auStack_2018[uVar3] = auStack_2018[uVar3] & ~(*pawVar5)[uVar3];
          }
        }
        else {
          for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            auStack_2018[uVar3] = auStack_2018[uVar3] & (*pawVar5)[uVar3];
          }
        }
        pawVar5 = pawVar5 + 1;
      }
      for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
        r[uVar2] = r[uVar2] | auStack_2018[uVar2];
      }
    }
    uVar2 = (ulong)(uVar4 + 1);
  }
  return;
}

Assistant:

static void If_CluComposeLut( int nVars, If_Grp_t * g, word * t, word f[6][CLU_WRD_MAX], word * r )
{
    word c[CLU_WRD_MAX];
    int m, v;
    If_CluClear( r, nVars ); 
    for ( m = 0; m < (1<<g->nVars); m++ )
    {
        if ( !((t[m >> 6] >> (m & 63)) & 1) )
            continue;
        If_CluFill( c, nVars );
        for ( v = 0; v < g->nVars; v++ )
            if ( (m >> v) & 1 )
                If_CluAnd( c, c, f[v], nVars );
            else
                If_CluSharp( c, c, f[v], nVars );
        If_CluOr( r, r, c, nVars );
    }
}